

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

void secp256k1_gej_neg(secp256k1_gej *r,secp256k1_gej *a)

{
  secp256k1_fe *a_00;
  ulong uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  secp256k1_gej_verify(a);
  r->infinity = a->infinity;
  uVar2 = (a->x).n[0];
  uVar3 = (a->x).n[1];
  uVar4 = (a->x).n[2];
  uVar5 = (a->x).n[3];
  iVar6 = (a->x).magnitude;
  iVar7 = (a->x).normalized;
  (r->x).n[4] = (a->x).n[4];
  (r->x).magnitude = iVar6;
  (r->x).normalized = iVar7;
  (r->x).n[2] = uVar4;
  (r->x).n[3] = uVar5;
  (r->x).n[0] = uVar2;
  (r->x).n[1] = uVar3;
  a_00 = &r->y;
  uVar2 = (a->y).n[1];
  uVar3 = (a->y).n[2];
  uVar4 = (a->y).n[3];
  uVar5 = (a->y).n[4];
  iVar6 = (a->y).magnitude;
  iVar7 = (a->y).normalized;
  (r->y).n[0] = (a->y).n[0];
  (r->y).n[1] = uVar2;
  (r->y).n[2] = uVar3;
  (r->y).n[3] = uVar4;
  (r->y).n[4] = uVar5;
  (r->y).magnitude = iVar6;
  (r->y).normalized = iVar7;
  uVar2 = (a->z).n[1];
  uVar3 = (a->z).n[2];
  uVar4 = (a->z).n[3];
  uVar5 = (a->z).n[4];
  iVar6 = (a->z).magnitude;
  iVar7 = (a->z).normalized;
  (r->z).n[0] = (a->z).n[0];
  (r->z).n[1] = uVar2;
  (r->z).n[2] = uVar3;
  (r->z).n[3] = uVar4;
  (r->z).n[4] = uVar5;
  (r->z).magnitude = iVar6;
  (r->z).normalized = iVar7;
  secp256k1_fe_verify(a_00);
  uVar1 = (r->y).n[4];
  uVar9 = (uVar1 >> 0x30) * 0x1000003d1 + (r->y).n[0];
  uVar8 = (uVar9 >> 0x34) + (r->y).n[1];
  uVar10 = (uVar8 >> 0x34) + (r->y).n[2];
  uVar11 = (uVar10 >> 0x34) + (r->y).n[3];
  (r->y).n[0] = uVar9 & 0xfffffffffffff;
  (r->y).n[1] = uVar8 & 0xfffffffffffff;
  (r->y).n[2] = uVar10 & 0xfffffffffffff;
  (r->y).n[3] = uVar11 & 0xfffffffffffff;
  (r->y).n[4] = (uVar11 >> 0x34) + (uVar1 & 0xffffffffffff);
  (r->y).magnitude = 1;
  secp256k1_fe_verify(a_00);
  secp256k1_fe_verify(a_00);
  secp256k1_fe_verify_magnitude(a_00,1);
  uVar2 = (r->y).n[1];
  uVar3 = (r->y).n[2];
  uVar4 = (r->y).n[3];
  (r->y).n[0] = 0x3ffffbfffff0bc - (r->y).n[0];
  (r->y).n[1] = 0x3ffffffffffffc - uVar2;
  (r->y).n[2] = 0x3ffffffffffffc - uVar3;
  (r->y).n[3] = 0x3ffffffffffffc - uVar4;
  (r->y).n[4] = 0x3fffffffffffc - (r->y).n[4];
  (r->y).magnitude = 2;
  (r->y).normalized = 0;
  secp256k1_fe_verify(a_00);
  secp256k1_gej_verify(r);
  return;
}

Assistant:

static void secp256k1_gej_neg(secp256k1_gej *r, const secp256k1_gej *a) {
    SECP256K1_GEJ_VERIFY(a);

    r->infinity = a->infinity;
    r->x = a->x;
    r->y = a->y;
    r->z = a->z;
    secp256k1_fe_normalize_weak(&r->y);
    secp256k1_fe_negate(&r->y, &r->y, 1);

    SECP256K1_GEJ_VERIFY(r);
}